

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_redraw_all(void)

{
  term *t;
  int local_18;
  errr one_result;
  wchar_t j;
  errr combined;
  term *old;
  
  t = Term;
  for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
    if (angband_term[local_18] != (term *)0x0) {
      Term_activate(angband_term[local_18]);
      Term_redraw();
    }
  }
  Term_activate(t);
  return 0;
}

Assistant:

extern errr Term_redraw_all(void)
{
	term *old = Term;
	errr combined = 0;
	int j;

	for (j = 0; j < ANGBAND_TERM_MAX; j++) {
		errr one_result;

		if (!angband_term[j]) continue;
		(void) Term_activate(angband_term[j]);
		one_result = Term_redraw();
		if (!one_result) {
			combined = one_result;
		}
	}
	(void) Term_activate(old);

	return combined;
}